

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall
TaprootScriptTree_TreeTest1_Test::~TaprootScriptTree_TreeTest1_Test
          (TaprootScriptTree_TreeTest1_Test *this)

{
  TaprootScriptTree_TreeTest1_Test *this_local;
  
  ~TaprootScriptTree_TreeTest1_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest1) {
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);
  SchnorrPubkey schnorr_pubkey2 = schnorr_pubkey.CreateTweakAdd(tweak1);
  SchnorrPubkey schnorr_pubkey3 = schnorr_pubkey.CreateTweakAdd(tweak2);

  Script script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree1(script);

  Script script_true = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  TaprootScriptTree tree2(script_true);

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script tree_2_of_2_sig = (ScriptBuilder() << schnorr_pubkey2.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey3.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree3(tree_2_of_2_sig);

  auto exp_hash = "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec";
  auto exp_str = "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  TaprootScriptTree root = tree1;
  root.AddBranch(tree2);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  root = tree2;
  root.AddBranch(tree1);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  auto branch = tree2;
  branch.AddBranch(tree1);
  root = tree3;
  root.AddBranch(branch);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  // blind leaf
  root = tree3;
  root.AddBranch(branch.GetCurrentBranchHash());
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(
      "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
      root.ToString());

  root = TaprootScriptTree::FromString(exp_str, script);
  EXPECT_EQ(script.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, script_true);
  EXPECT_EQ(script_true.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, tree_2_of_2_sig);
  EXPECT_EQ(tree_2_of_2_sig.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(1, root.GetBranchList().size());
}